

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O1

void DepParserTask::convert_to_onelearner_actions
               (search *sch,v_array<unsigned_int> *actions,v_array<unsigned_int> *actions_onelearner
               ,uint32_t left_label,uint32_t right_label)

{
  void *pvVar1;
  uint *puVar2;
  undefined8 in_RAX;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 uStack_38;
  
  pvVar1 = sch->task_data;
  uStack_38 = in_RAX;
  v_array<unsigned_int>::clear(actions_onelearner);
  puVar2 = actions->_begin;
  lVar3 = (long)actions->_end - (long)puVar2;
  bVar7 = lVar3 != 0;
  if (lVar3 == 0) {
LAB_00294d74:
    if (bVar7) goto LAB_00294d78;
  }
  else {
    uVar4 = lVar3 >> 2;
    if (*puVar2 != 1) {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (uVar4 + (uVar4 == 0) == uVar5) break;
        uVar6 = uVar5 + 1;
      } while (puVar2[uVar5] != 1);
      bVar7 = uVar5 < uVar4;
      goto LAB_00294d74;
    }
LAB_00294d78:
    v_array<unsigned_int>::push_back(actions_onelearner,&SHIFT);
  }
  if (*(int *)((long)pvVar1 + 0x2c4) == 2) {
    puVar2 = actions->_begin;
    lVar3 = (long)actions->_end - (long)puVar2;
    bVar7 = lVar3 != 0;
    if (lVar3 == 0) {
LAB_00294dd2:
      if (!bVar7) goto LAB_00294df1;
    }
    else {
      uVar4 = lVar3 >> 2;
      if (*puVar2 != 4) {
        uVar6 = 1;
        do {
          uVar5 = uVar6;
          if (uVar4 + (uVar4 == 0) == uVar5) break;
          uVar6 = uVar5 + 1;
        } while (puVar2[uVar5] != 4);
        bVar7 = uVar5 < uVar4;
        goto LAB_00294dd2;
      }
    }
    uStack_38 = CONCAT44(*(int *)((long)pvVar1 + 0x10) * 2 + 2,(undefined4)uStack_38);
    v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
  }
LAB_00294df1:
  if (left_label != 9999999) {
    puVar2 = actions->_begin;
    lVar3 = (long)actions->_end - (long)puVar2;
    bVar7 = lVar3 != 0;
    if (lVar3 == 0) {
LAB_00294e3e:
      if (bVar7) goto LAB_00294e42;
    }
    else {
      uVar4 = lVar3 >> 2;
      if (*puVar2 != 2) {
        uVar6 = 1;
        do {
          uVar5 = uVar6;
          if (uVar4 + (uVar4 == 0) == uVar5) break;
          uVar6 = uVar5 + 1;
        } while (puVar2[uVar5] != 2);
        bVar7 = uVar5 < uVar4;
        goto LAB_00294e3e;
      }
LAB_00294e42:
      uStack_38 = CONCAT44(right_label + 1,(undefined4)uStack_38);
      v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
    }
    puVar2 = actions->_begin;
    lVar3 = (long)actions->_end - (long)puVar2;
    bVar7 = lVar3 != 0;
    if (lVar3 == 0) {
LAB_00294e93:
      if (bVar7) goto LAB_00294e97;
    }
    else {
      uVar4 = lVar3 >> 2;
      if (*puVar2 != 3) {
        uVar6 = 1;
        do {
          uVar5 = uVar6;
          if (uVar4 + (uVar4 == 0) == uVar5) break;
          uVar6 = uVar5 + 1;
        } while (puVar2[uVar5] != 3);
        bVar7 = uVar5 < uVar4;
        goto LAB_00294e93;
      }
LAB_00294e97:
      uStack_38 = CONCAT44(*(int *)((long)pvVar1 + 0x10) + left_label + 1,(undefined4)uStack_38);
      v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
    }
    if (left_label != 9999999) {
      return;
    }
  }
  puVar2 = actions->_begin;
  lVar3 = (long)actions->_end - (long)puVar2;
  bVar7 = lVar3 != 0;
  if (lVar3 == 0) {
LAB_00294efd:
    if (bVar7) goto LAB_00294f01;
  }
  else {
    uVar4 = lVar3 >> 2;
    if (*puVar2 != 2) {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (uVar4 + (uVar4 == 0) == uVar5) break;
        uVar6 = uVar5 + 1;
      } while (puVar2[uVar5] != 2);
      bVar7 = uVar5 < uVar4;
      goto LAB_00294efd;
    }
LAB_00294f01:
    if (*(int *)((long)pvVar1 + 0x10) != 0) {
      uVar4 = 0;
      do {
        if (uVar4 != *(long *)((long)pvVar1 + 8) - 1U) {
          uStack_38 = CONCAT44((int)uVar4 + 2,(undefined4)uStack_38);
          v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < *(uint *)((long)pvVar1 + 0x10));
    }
  }
  puVar2 = actions->_begin;
  lVar3 = (long)actions->_end - (long)puVar2;
  bVar7 = lVar3 != 0;
  if (bVar7) {
    uVar4 = lVar3 >> 2;
    if (*puVar2 == 3) goto LAB_00294f82;
    uVar6 = 1;
    do {
      uVar5 = uVar6;
      if (uVar4 + (uVar4 == 0) == uVar5) break;
      uVar6 = uVar5 + 1;
    } while (puVar2[uVar5] != 3);
    bVar7 = uVar5 < uVar4;
  }
  if (!bVar7) {
    return;
  }
LAB_00294f82:
  uVar4 = (ulong)*(uint *)((long)pvVar1 + 0x10);
  if (*(uint *)((long)pvVar1 + 0x10) != 0) {
    uVar6 = 0;
    do {
      if ((*(int *)((long)pvVar1 + 0x2c4) == 2) || (uVar6 != *(long *)((long)pvVar1 + 8) - 1U)) {
        uStack_38 = CONCAT44((int)uVar4 + (int)uVar6 + 2,(undefined4)uStack_38);
        v_array<unsigned_int>::push_back(actions_onelearner,(uint *)((long)&uStack_38 + 4));
      }
      uVar6 = uVar6 + 1;
      uVar4 = (ulong)*(uint *)((long)pvVar1 + 0x10);
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void convert_to_onelearner_actions(Search::search &sch, v_array<action> &actions, v_array<action> &actions_onelearner,
    uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  uint32_t &sys = data->transition_system;
  uint32_t &num_label = data->num_label;
  actions_onelearner.clear();
  if (is_valid(SHIFT, actions))
    actions_onelearner.push_back(SHIFT);
  if (sys == arc_eager && is_valid(REDUCE, actions))
    actions_onelearner.push_back(2 + 2 * num_label);
  if (left_label != my_null && is_valid(REDUCE_RIGHT, actions))
    actions_onelearner.push_back(1 + right_label);
  if (left_label != my_null && is_valid(REDUCE_LEFT, actions))
    actions_onelearner.push_back(1 + left_label + num_label);
  if (left_label == my_null && is_valid(REDUCE_RIGHT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (i != data->root_label - 1)
        actions_onelearner.push_back(i + 2);
  if (left_label == my_null && is_valid(REDUCE_LEFT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (sys == arc_eager || i != data->root_label - 1)
        actions_onelearner.push_back((uint32_t)(i + 2 + num_label));
}